

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvode_ls.c
# Opt level: O0

int CVodeGetLinSolveStats
              (void *cvode_mem,long *njevals,long *nfevalsLS,long *nliters,long *nlcfails,
              long *npevals,long *npsolves,long *njtsetups,long *njtimes)

{
  undefined8 uVar1;
  undefined8 *in_RCX;
  undefined8 *in_RDX;
  undefined8 *in_RSI;
  undefined8 *in_R8;
  undefined8 *in_R9;
  undefined8 *in_stack_00000008;
  int retval;
  CVLsMem cvls_mem;
  CVodeMem cv_mem;
  CVodeMem *in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  void *in_stack_ffffffffffffffb8;
  int local_4;
  
  local_4 = cvLs_AccessLMem(in_stack_ffffffffffffffb8,
                            (char *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                            in_stack_ffffffffffffffa8,(CVLsMem *)0x120b4c);
  if (local_4 == 0) {
    *in_RSI = *(undefined8 *)((long)in_stack_ffffffffffffffb8 + 0x88);
    *in_RDX = *(undefined8 *)((long)in_stack_ffffffffffffffb8 + 0x90);
    *in_RCX = *(undefined8 *)((long)in_stack_ffffffffffffffb8 + 0xa8);
    *in_R8 = *(undefined8 *)((long)in_stack_ffffffffffffffb8 + 0xb8);
    *in_R9 = *(undefined8 *)((long)in_stack_ffffffffffffffb8 + 0xa0);
    *in_stack_00000008 = *(undefined8 *)((long)in_stack_ffffffffffffffb8 + 0xb0);
    uVar1 = *(undefined8 *)((long)in_stack_ffffffffffffffb8 + 0xc0);
    cvls_mem->iterative = (int)uVar1;
    cvls_mem->matrixbased = (int)((ulong)uVar1 >> 0x20);
    cv_mem->cv_sunctx = *(SUNContext_conflict *)((long)in_stack_ffffffffffffffb8 + 200);
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int CVodeGetLinSolveStats(void* cvode_mem, long int* njevals, long int* nfevalsLS,
                          long int* nliters, long int* nlcfails,
                          long int* npevals, long int* npsolves,
                          long int* njtsetups, long int* njtimes)
{
  CVodeMem cv_mem;
  CVLsMem cvls_mem;
  int retval;

  /* access CVLsMem structure; set output value and return */
  retval = cvLs_AccessLMem(cvode_mem, __func__, &cv_mem, &cvls_mem);
  if (retval != CVLS_SUCCESS) { return (retval); }

  *njevals   = cvls_mem->nje;
  *nfevalsLS = cvls_mem->nfeDQ;
  *nliters   = cvls_mem->nli;
  *nlcfails  = cvls_mem->ncfl;
  *npevals   = cvls_mem->npe;
  *npsolves  = cvls_mem->nps;
  *njtsetups = cvls_mem->njtsetup;
  *njtimes   = cvls_mem->njtimes;

  return (CVLS_SUCCESS);
}